

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script)

{
  uint32_t uVar1;
  ByteData local_88;
  ConfidentialNonce local_70;
  ByteData local_48;
  
  local_70._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
  ByteData::ByteData(&local_70.data_);
  local_70.version_ = '\0';
  ByteData::ByteData(&local_88);
  ByteData::ByteData(&local_48);
  uVar1 = AddTxOut(this,value,asset,locking_script,&local_70,&local_88,&local_48);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_70._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
  if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script) {
  return AddTxOut(
      value, asset, locking_script, ConfidentialNonce(), ByteData(),
      ByteData());
}